

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::GlobalTimeCoordinator::sendTimeUpdateRequest(GlobalTimeCoordinator *this,Time triggerTime)

{
  GlobalFederateId sourceId;
  pointer pDVar1;
  long lVar2;
  DependencyInfo *dep;
  pointer pDVar3;
  ActionMessage updateTime;
  
  sourceId.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  ActionMessage::ActionMessage(&updateTime,cmd_request_current_time,sourceId,sourceId);
  updateTime.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    lVar2 = (pDVar3->super_TimeData).next.internalTimeCode;
    if (lVar2 != 0x7fffffffffffffff && lVar2 <= triggerTime.internalTimeCode) {
      updateTime.dest_id.gid = (pDVar3->fedID).gid;
      updateTime.source_handle.hid = (pDVar3->super_TimeData).sequenceCounter;
      pDVar3->updateRequested = true;
      (pDVar3->super_TimeData).grantedIteration = (this->super_BaseTimeCoordinator).sequenceCounter;
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&updateTime);
    }
  }
  ActionMessage::~ActionMessage(&updateTime);
  return;
}

Assistant:

void GlobalTimeCoordinator::sendTimeUpdateRequest(Time triggerTime)
{
    ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME, mSourceId, mSourceId);
    updateTime.counter = sequenceCounter;
    for (auto& dep : dependencies) {
        if (dep.next <= triggerTime && dep.next < cBigTime) {
            updateTime.dest_id = dep.fedID;
            updateTime.setExtraDestData(dep.sequenceCounter);
            dep.updateRequested = true;
            dep.grantedIteration = sequenceCounter;
            sendMessageFunction(updateTime);
        }
    }
}